

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

int __thiscall ncnn::Log::forward_inplace(Log *this,Mat *bottom_top_blob)

{
  void *pvVar1;
  int i_1;
  int i;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int c;
  float fVar7;
  float fVar8;
  Mat local_60;
  
  uVar2 = bottom_top_blob->c;
  uVar5 = bottom_top_blob->h * bottom_top_blob->w;
  if (this->base == -1.0) {
    uVar4 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar4;
    }
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    while (c = (int)uVar4, c != (int)uVar3) {
      Mat::channel(&local_60,bottom_top_blob,c);
      pvVar1 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        fVar7 = logf(this->scale * *(float *)((long)pvVar1 + uVar4 * 4) + this->shift);
        *(float *)((long)pvVar1 + uVar4 * 4) = fVar7;
      }
      uVar4 = (ulong)(c + 1);
    }
  }
  else {
    fVar7 = logf(this->base);
    uVar4 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar4;
    }
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    while (uVar5 = (uint)uVar4, uVar5 != uVar2) {
      Mat::channel(&local_60,bottom_top_blob,uVar5);
      pvVar1 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        fVar8 = logf(this->scale * *(float *)((long)pvVar1 + uVar4 * 4) + this->shift);
        *(float *)((long)pvVar1 + uVar4 * 4) = fVar8 * (1.0 / fVar7);
      }
      uVar4 = (ulong)(uVar5 + 1);
    }
  }
  return 0;
}

Assistant:

int Log::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = log(shift + ptr[i] * scale);
            }
        }
    }
    else
    {
        float log_base_inv = 1.f / log(base);

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = log(shift + ptr[i] * scale) * log_base_inv;
            }
        }
    }

    return 0;
}